

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  size_t *psVar1;
  undefined8 uVar2;
  _List_node_base *p_Var3;
  undefined8 *puVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined1 auVar7 [8];
  size_t sVar8;
  char cVar9;
  istream *this;
  _List_node_base *p_Var10;
  long *plVar11;
  int *piVar12;
  pointer pcVar13;
  int *piVar14;
  undefined4 uVar15;
  ulong uVar16;
  _Node *__tmp;
  int iVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  undefined8 uStack_b0;
  int aiStack_a8 [2];
  undefined1 *local_a0;
  int local_98;
  int local_94;
  int N;
  int X;
  int Y;
  uint local_80;
  uint local_7c;
  int W;
  int H;
  undefined1 local_70 [8];
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> lake;
  string row;
  
  uStack_b0 = 0x101283;
  std::istream::operator>>((istream *)&std::cin,(int *)&local_80);
  uStack_b0 = 0x10128b;
  std::istream::ignore();
  uStack_b0 = 0x10129a;
  std::istream::operator>>((istream *)&std::cin,(int *)&local_7c);
  uStack_b0 = 0x1012a2;
  std::istream::ignore();
  uVar20 = (ulong)local_7c;
  lVar5 = -(local_80 * uVar20 * 4 + 0xf & 0xfffffffffffffff0);
  piVar14 = (int *)((long)aiStack_a8 + lVar5);
  local_a0 = (undefined1 *)aiStack_a8;
  _Y = piVar14;
  if (0 < (int)local_7c) {
    lVar18 = 0;
    local_a0 = (undefined1 *)aiStack_a8;
    do {
      lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      _M_node._M_size = (size_t)&row._M_string_length;
      row._M_dataplus._M_p = (pointer)0x0;
      row._M_string_length = row._M_string_length & 0xffffffffffffff00;
      uVar2 = *(undefined8 *)(std::cin + -0x18);
      *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x10130e;
      cVar9 = std::ios::widen((char)uVar2 + -0x70);
      *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x10131d;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,
                 (string *)
                 &lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl._M_node._M_size,cVar9);
      sVar8 = lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl._M_node._M_size;
      if (row._M_dataplus._M_p != (pointer)(long)(int)local_80) {
        *(undefined1 **)((long)aiStack_a8 + lVar5 + -8) = &LAB_001016da;
        __assert_fail("static_cast<size_t>(W) == row.length()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/hard/surface/main.cpp"
                      ,0x1b,"int main()");
      }
      if (0 < (int)local_80) {
        pcVar13 = (pointer)0x0;
        piVar12 = piVar14;
        do {
          *piVar12 = -(uint)(pcVar13[lake.
                                     super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl._M_node._M_size] == 'O');
          pcVar13 = pcVar13 + 1;
          piVar12 = piVar12 + uVar20;
        } while ((pointer)(long)(int)local_80 != pcVar13);
      }
      if ((size_type *)
          lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          _M_node._M_size != &row._M_string_length) {
        uVar16 = row._M_string_length + 1;
        *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x101366;
        operator_delete((void *)sVar8,uVar16);
      }
      lVar18 = lVar18 + 1;
      piVar14 = piVar14 + 1;
    } while (lVar18 < (int)local_7c);
  }
  *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x101393;
  std::istream::operator>>((istream *)&std::cin,&local_98);
  *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x10139b;
  std::istream::ignore();
  if (0 < local_98) {
    iVar17 = 0;
    _W = uVar20;
    do {
      uVar20 = _W;
      *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x1013c6;
      this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_94);
      *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x1013d5;
      std::istream::operator>>(this,&N);
      *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x1013dd;
      std::istream::ignore();
      p_Var3 = (_List_node_base *)CONCAT44(N,local_94);
      uVar15 = _Y[(long)local_94 * uVar20 + (long)N];
      if (uVar15 == -1) {
        psVar1 = &lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl._M_node._M_size;
        row._M_string_length = 0;
        lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
        X = iVar17;
        local_70 = (undefined1  [8])local_70;
        lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        _M_node.super__List_node_base._M_next = (_List_node_base *)local_70;
        lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        _M_node._M_size = (size_t)psVar1;
        row._M_dataplus._M_p = (pointer)psVar1;
        *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x101436;
        p_Var10 = (_List_node_base *)operator_new(0x18);
        p_Var10[1]._M_next = p_Var3;
        *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x101451;
        std::__detail::_List_node_base::_M_hook(p_Var10);
        row._M_string_length = row._M_string_length + 1;
        uVar20 = _W;
        if ((size_t *)
            lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl._M_node._M_size == psVar1) {
          row.field_2._12_4_ = 0;
        }
        else {
          row.field_2._12_4_ = 0;
          do {
            sVar8 = lake.
                    super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl._M_node._M_size;
            p_Var3 = *(_List_node_base **)
                      (lake.
                       super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                       _M_impl._M_node._M_size + 0x10);
            row._M_string_length = row._M_string_length - 1;
            *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x101488;
            std::__detail::_List_node_base::_M_unhook();
            *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x101495;
            operator_delete((void *)sVar8,0x18);
            iVar17 = (int)p_Var3;
            if (_Y[(long)iVar17 * uVar20 + ((long)p_Var3 >> 0x20)] == -1) {
              row.field_2._12_4_ = row.field_2._12_4_ + 1;
              _Y[(long)iVar17 * uVar20 + ((long)p_Var3 >> 0x20)] = row.field_2._12_4_;
              *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x1014ca;
              p_Var10 = (_List_node_base *)operator_new(0x18);
              uVar16 = (ulong)p_Var3 & 0xffffffff00000000;
              p_Var10[1]._M_next = p_Var3;
              *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x1014e0;
              std::__detail::_List_node_base::_M_hook(p_Var10);
              lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl._M_node.super__List_node_base._M_prev =
                   (_List_node_base *)
                   ((long)&(lake.
                            super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
              if (0 < iVar17) {
                *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x1014f7;
                p_Var10 = (_List_node_base *)operator_new(0x18);
                p_Var10[1]._M_next = (_List_node_base *)(iVar17 - 1 | uVar16);
                *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x101511;
                std::__detail::_List_node_base::_M_hook(p_Var10);
                row._M_string_length = row._M_string_length + 1;
              }
              iVar19 = (int)((ulong)p_Var3 >> 0x20);
              if (0 < iVar19) {
                *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x10152e;
                p_Var10 = (_List_node_base *)operator_new(0x18);
                p_Var10[1]._M_next =
                     (_List_node_base *)(uVar16 - 0x100000000 | (ulong)p_Var3 & 0xffffffff);
                *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x101545;
                std::__detail::_List_node_base::_M_hook(p_Var10);
                row._M_string_length = row._M_string_length + 1;
              }
              if (iVar17 < (int)(local_80 - 1)) {
                *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x10155d;
                p_Var10 = (_List_node_base *)operator_new(0x18);
                p_Var10[1]._M_next = (_List_node_base *)(iVar17 + 1 | uVar16);
                *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x101573;
                std::__detail::_List_node_base::_M_hook(p_Var10);
                row._M_string_length = row._M_string_length + 1;
              }
              uVar20 = _W;
              if (iVar19 < (int)(local_7c - 1)) {
                *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x10158b;
                p_Var10 = (_List_node_base *)operator_new(0x18);
                uVar20 = _W;
                p_Var10[1]._M_next =
                     (_List_node_base *)(((ulong)p_Var3 & 0xffffffff) + uVar16 + 0x100000000);
                *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x1015ae;
                std::__detail::_List_node_base::_M_hook(p_Var10);
                row._M_string_length = row._M_string_length + 1;
              }
            }
          } while ((size_t *)
                   lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                   ._M_impl._M_node._M_size !=
                   &lake.
                    super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl._M_node._M_size);
        }
        uVar15 = row.field_2._12_4_;
        piVar14 = _Y;
        if (local_70 != (undefined1  [8])local_70) {
          do {
            auVar7 = local_70;
            piVar14[(long)*(int *)&((_List_node_base *)((long)local_70 + 0x10))->_M_next * uVar20 +
                    (long)*(int *)((long)&((_List_node_base *)((long)local_70 + 0x10))->_M_next + 4)
                   ] = uVar15;
            lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl._M_node.super__List_node_base._M_prev =
                 (_List_node_base *)
                 ((long)&lake.
                         super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl._M_node.super__List_node_base._M_prev[-1]._M_prev + 7);
            *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x10160b;
            std::__detail::_List_node_base::_M_unhook();
            *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x101618;
            operator_delete((void *)auVar7,0x18);
          } while (local_70 != (undefined1  [8])local_70);
        }
        iVar17 = X;
        puVar6 = (undefined8 *)
                 lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl._M_node._M_size;
        uVar15 = row.field_2._12_4_;
        while (X = iVar17, row.field_2._12_4_ = uVar15,
              puVar6 != &lake.
                         super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl._M_node._M_size) {
          puVar4 = (undefined8 *)*puVar6;
          *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x101643;
          operator_delete(puVar6,0x18);
          iVar17 = X;
          puVar6 = puVar4;
          uVar15 = row.field_2._12_4_;
        }
      }
      *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x101665;
      plVar11 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar15);
      uVar2 = *(undefined8 *)(*plVar11 + -0x18);
      *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x10167c;
      std::ios::widen((char)uVar2 + (char)plVar11);
      *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x101687;
      std::ostream::put((char)plVar11);
      *(undefined8 *)((long)aiStack_a8 + lVar5 + -8) = 0x10168f;
      std::ostream::flush();
      iVar17 = iVar17 + 1;
    } while (iVar17 < local_98);
  }
  return 0;
}

Assistant:

int main()
{
	int W;
	int H;
	std::cin >> W;
	std::cin.ignore();
	std::cin >> H;
	std::cin.ignore();

typedef std::pair<int, int> pos_t;
    int surf[W][H];
	for (int i = 0; i < H; i++)
	{
	    std::string row;
	    std::getline(std::cin, row);
	    assert(static_cast<size_t>(W) == row.length());
	    int l = row.length();
	    for (int j = 0; j < l; j++)
	    {
	        if ('O' == row[j])
	        {
	            surf[j][i] = -1;
	        }
	        else
	        {
	            surf[j][i] = 0;
	        }
	    }
	}
	
    // Tests
    int N;
    std::cin >> N;
    std::cin.ignore();
	for (int i = 0; i < N; i++)
	{
	    int X;
	    int Y;
	    std::cin >> X >> Y;
	    std::cin.ignore();
	    
	    int result;
	    if (-1 == surf[X][Y])
	    {
	        // Fill
	        result = 0;
	        std::list<pos_t> to_process;
	        std::list<pos_t> lake;
	        
	        to_process.push_back(pos_t(X, Y));
	        while (!to_process.empty())
	        {
	            const pos_t p = to_process.front();
	            to_process.pop_front();
	            if (-1 == surf[p.first][p.second])
	            {
	                result++;
	                surf[p.first][p.second] = result;
	                lake.push_back(p);
	                
	                if (0 < p.first)
	                {
	                    to_process.push_back(pos_t(p.first - 1, p.second));
	                }
	                if (0 < p.second)
	                {
	                    to_process.push_back(pos_t(p.first, p.second - 1));
	                }
	                if (p.first < W - 1)
	                {
	                    to_process.push_back(pos_t(p.first + 1, p.second));
	                }
	                if (p.second < H - 1)
	                {
	                    to_process.push_back(pos_t(p.first, p.second + 1));
	                }
	            }
	        }
	        
	        while (!lake.empty())
	        {
	            const pos_t p = lake.front();
	            surf[p.first][p.second] = result;
	            lake.pop_front();
	        }
	    }
	    else
	    {
	        result = surf[X][Y];
	    }
	    std::cout << result << std::endl;
	}

	return 0;
}